

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

ExplainFormat __thiscall
duckdb::QueryProfiler::GetExplainFormat(QueryProfiler *this,ProfilerPrintFormat format)

{
  ExplainFormat EVar1;
  InternalException *this_00;
  NotImplementedException *this_01;
  ulong uVar2;
  undefined7 in_register_00000031;
  allocator local_59;
  string local_58;
  string local_38;
  
  uVar2 = CONCAT71(in_register_00000031,format) & 0xffffffff;
  switch(uVar2) {
  case 0:
  case 2:
    EVar1 = TEXT;
    break;
  case 1:
    EVar1 = JSON;
    break;
  case 3:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_58,
               "Should not attempt to get ExplainFormat for ProfilerPrintFormat::NO_OUTPUT",
               &local_59);
    InternalException::InternalException(this_00,&local_58);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 4:
    EVar1 = HTML;
    break;
  case 5:
    EVar1 = GRAPHVIZ;
    break;
  default:
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_58,"No mapping from ProfilePrintFormat::%s to ExplainFormat",
               &local_59);
    EnumUtil::ToString<duckdb::ProfilerPrintFormat>(&local_38,(ProfilerPrintFormat)uVar2);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_01,(string *)&local_58,&local_38);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return EVar1;
}

Assistant:

ExplainFormat QueryProfiler::GetExplainFormat(ProfilerPrintFormat format) const {
	switch (format) {
	case ProfilerPrintFormat::QUERY_TREE:
	case ProfilerPrintFormat::QUERY_TREE_OPTIMIZER:
		return ExplainFormat::TEXT;
	case ProfilerPrintFormat::JSON:
		return ExplainFormat::JSON;
	case ProfilerPrintFormat::HTML:
		return ExplainFormat::HTML;
	case ProfilerPrintFormat::GRAPHVIZ:
		return ExplainFormat::GRAPHVIZ;
	case ProfilerPrintFormat::NO_OUTPUT:
		throw InternalException("Should not attempt to get ExplainFormat for ProfilerPrintFormat::NO_OUTPUT");
	default:
		throw NotImplementedException("No mapping from ProfilePrintFormat::%s to ExplainFormat",
		                              EnumUtil::ToString(format));
	}
}